

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleShaderBuiltInTests.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::pipeline::multisample::MSInstance<vkt::pipeline::multisample::MSInstanceSampleMaskWrite>::
verifyImageData(TestStatus *__return_storage_ptr__,
               MSInstance<vkt::pipeline::multisample::MSInstanceSampleMaskWrite> *this,
               VkImageCreateInfo *imageMSInfo,VkImageCreateInfo *imageRSInfo,
               vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
               *dataPerSample,ConstPixelBufferAccess *dataRS)

{
  const_reference pvVar1;
  uint *puVar2;
  float *pfVar3;
  float fVar4;
  allocator<char> local_101;
  string local_100;
  allocator<char> local_d9;
  string local_d8;
  undefined1 local_b4 [24];
  float firstComponent_1;
  deUint32 x_1;
  deUint32 y_1;
  deUint32 z_1;
  allocator<char> local_81;
  string local_80;
  undefined1 local_60 [24];
  deUint32 firstComponent;
  deUint32 sampleNdx;
  deUint32 x;
  deUint32 y;
  deUint32 z;
  deUint32 numSamples;
  ConstPixelBufferAccess *dataRS_local;
  vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
  *dataPerSample_local;
  VkImageCreateInfo *imageRSInfo_local;
  VkImageCreateInfo *imageMSInfo_local;
  MSInstance<vkt::pipeline::multisample::MSInstanceSampleMaskWrite> *this_local;
  
  y = imageMSInfo->samples;
  x = 0;
  _z = dataRS;
  dataRS_local = (ConstPixelBufferAccess *)dataPerSample;
  dataPerSample_local =
       (vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> *)
       imageRSInfo;
  imageRSInfo_local = imageMSInfo;
  imageMSInfo_local = (VkImageCreateInfo *)this;
  this_local = (MSInstance<vkt::pipeline::multisample::MSInstanceSampleMaskWrite> *)
               __return_storage_ptr__;
  do {
    if ((imageRSInfo_local->extent).depth <= x) {
      x_1 = 0;
      do {
        if (*(uint *)((long)&dataPerSample_local[1].
                             super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                             ._M_impl.super__Vector_impl_data._M_finish + 4) <= x_1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_100,"Passed",&local_101);
          tcu::TestStatus::pass(__return_storage_ptr__,&local_100);
          std::__cxx11::string::~string((string *)&local_100);
          std::allocator<char>::~allocator(&local_101);
          return __return_storage_ptr__;
        }
        for (firstComponent_1 = 0.0;
            (uint)firstComponent_1 <
            (uint)*(float *)&dataPerSample_local[1].
                             super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                             ._M_impl.super__Vector_impl_data._M_finish;
            firstComponent_1 = (float)((int)firstComponent_1 + 1)) {
          for (local_b4._20_4_ = 0;
              (uint)local_b4._20_4_ <
              *(uint *)((long)&dataPerSample_local[1].
                               super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                               ._M_impl.super__Vector_impl_data._M_start + 4);
              local_b4._20_4_ = local_b4._20_4_ + 1) {
            tcu::ConstPixelBufferAccess::getPixel
                      ((ConstPixelBufferAccess *)local_b4,(int)_z,local_b4._20_4_,
                       (int)firstComponent_1);
            pfVar3 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)local_b4,0);
            local_b4._16_4_ = *pfVar3;
            fVar4 = deFloatAbs((float)local_b4._16_4_ - 0.5);
            if (0.02 < fVar4) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_d8,
                         "Expected resolve color to be half intensity on the first channel",
                         &local_d9);
              tcu::TestStatus::fail(__return_storage_ptr__,&local_d8);
              std::__cxx11::string::~string((string *)&local_d8);
              std::allocator<char>::~allocator(&local_d9);
              return __return_storage_ptr__;
            }
          }
        }
        x_1 = x_1 + 1;
      } while( true );
    }
    for (sampleNdx = 0; sampleNdx < (imageRSInfo_local->extent).height; sampleNdx = sampleNdx + 1) {
      for (firstComponent = 0; firstComponent < (imageRSInfo_local->extent).width;
          firstComponent = firstComponent + 1) {
        for (local_60._20_4_ = 0; (uint)local_60._20_4_ < y; local_60._20_4_ = local_60._20_4_ + 1)
        {
          pvVar1 = std::
                   vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                   ::operator[]((vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                                 *)dataRS_local,(ulong)(uint)local_60._20_4_);
          tcu::ConstPixelBufferAccess::getPixelUint
                    ((ConstPixelBufferAccess *)local_60,(int)pvVar1,firstComponent,sampleNdx);
          puVar2 = tcu::Vector<unsigned_int,_4>::operator[]((Vector<unsigned_int,_4> *)local_60,0);
          local_60._16_4_ = *puVar2;
          if ((local_60._16_4_ != 0) && (local_60._16_4_ != 0xff)) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_80,
                       "Expected color to be zero or saturated on the first channel",&local_81);
            tcu::TestStatus::fail(__return_storage_ptr__,&local_80);
            std::__cxx11::string::~string((string *)&local_80);
            std::allocator<char>::~allocator(&local_81);
            return __return_storage_ptr__;
          }
        }
      }
    }
    x = x + 1;
  } while( true );
}

Assistant:

tcu::TestStatus MSInstance<MSInstanceSampleMaskWrite>::verifyImageData	(const vk::VkImageCreateInfo&						imageMSInfo,
																					 const vk::VkImageCreateInfo&						imageRSInfo,
																					 const std::vector<tcu::ConstPixelBufferAccess>&	dataPerSample,
																					 const tcu::ConstPixelBufferAccess&					dataRS) const
{
	const deUint32 numSamples = static_cast<deUint32>(imageMSInfo.samples);

	for (deUint32 z = 0u; z < imageMSInfo.extent.depth;  ++z)
	for (deUint32 y = 0u; y < imageMSInfo.extent.height; ++y)
	for (deUint32 x = 0u; x < imageMSInfo.extent.width;  ++x)
	{
		for (deUint32 sampleNdx = 0u; sampleNdx < numSamples; ++sampleNdx)
		{
			const deUint32 firstComponent = dataPerSample[sampleNdx].getPixelUint(x, y, z)[0];

			if (firstComponent != 0u && firstComponent != 255u)
				return tcu::TestStatus::fail("Expected color to be zero or saturated on the first channel");
		}
	}

	for (deUint32 z = 0u; z < imageRSInfo.extent.depth;  ++z)
	for (deUint32 y = 0u; y < imageRSInfo.extent.height; ++y)
	for (deUint32 x = 0u; x < imageRSInfo.extent.width;  ++x)
	{
		const float firstComponent = dataRS.getPixel(x, y, z)[0];

		if (deFloatAbs(firstComponent - 0.5f) > 0.02f)
			return tcu::TestStatus::fail("Expected resolve color to be half intensity on the first channel");
	}

	return tcu::TestStatus::pass("Passed");
}